

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylehelper.cpp
# Opt level: O3

qreal QStyleHelper::dpi(QStyleOption *option)

{
  char cVar1;
  int iVar2;
  qreal qVar3;
  
  cVar1 = QCoreApplication::testAttribute(AA_Use96Dpi);
  if (cVar1 == '\0') {
    if (option != (QStyleOption *)0x0) {
      qVar3 = (qreal)QFontMetrics::fontDpi();
      return qVar3;
    }
    iVar2 = qt_defaultDpiX();
    qVar3 = (qreal)iVar2;
  }
  else {
    qVar3 = 96.0;
  }
  return qVar3;
}

Assistant:

Q_WIDGETS_EXPORT qreal dpi(const QStyleOption *option)
{
#ifndef Q_OS_DARWIN
    // Prioritize the application override, except for on macOS where
    // we have historically not supported the AA_Use96Dpi flag.
    if (QCoreApplication::testAttribute(Qt::AA_Use96Dpi))
        return 96;
#endif

    // Expect that QStyleOption::QFontMetrics::QFont has the correct DPI set
    if (option)
        return option->fontMetrics.fontDpi();

    // Fall back to historical Qt behavior: hardocded 72 DPI on mac,
    // primary screen DPI on other platforms.
#ifdef Q_OS_DARWIN
    return qstyleBaseDpi;
#else
    return qt_defaultDpiX();
#endif
}